

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall testing::internal::AssertHelper::~AssertHelper(AssertHelper *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  AssertHelperData *pAVar2;
  pointer pcVar3;
  
  pAVar2 = this->data_;
  if (pAVar2 != (AssertHelperData *)0x0) {
    pcVar3 = (pAVar2->message)._M_dataplus._M_p;
    paVar1 = &(pAVar2->message).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
  }
  operator_delete(pAVar2,0x38);
  return;
}

Assistant:

AssertHelper::~AssertHelper() {
  delete data_;
}